

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int read_line(lua_State *L,FILE *f)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *p;
  size_t l;
  luaL_Buffer b;
  FILE *f_local;
  lua_State *L_local;
  
  b.buffer._8184_8_ = f;
  luaL_buffinit(L,(luaL_Buffer *)&l);
  while( true ) {
    __s = luaL_prepbuffer((luaL_Buffer *)&l);
    pcVar1 = fgets(__s,0x2000,(FILE *)b.buffer._8184_8_);
    if (pcVar1 == (char *)0x0) {
      luaL_pushresult((luaL_Buffer *)&l);
      sVar2 = lua_objlen(L,-1);
      return (uint)(sVar2 != 0);
    }
    sVar3 = strlen(__s);
    if ((sVar3 != 0) && (__s[sVar3 - 1] == '\n')) break;
    l = sVar3 + l;
  }
  l = (sVar3 - 1) + l;
  luaL_pushresult((luaL_Buffer *)&l);
  return 1;
}

Assistant:

static int read_line(lua_State*L,FILE*f){
luaL_Buffer b;
luaL_buffinit(L,&b);
for(;;){
size_t l;
char*p=luaL_prepbuffer(&b);
if(fgets(p,BUFSIZ,f)==NULL){
luaL_pushresult(&b);
return(lua_objlen(L,-1)>0);
}
l=strlen(p);
if(l==0||p[l-1]!='\n')
luaL_addsize(&b,l);
else{
luaL_addsize(&b,l-1);
luaL_pushresult(&b);
return 1;
}
}
}